

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpbrk.c
# Opt level: O0

char * strpbrk(char *__s,char *__accept)

{
  char cVar1;
  char *local_30;
  char *p2;
  char *p1;
  char *s2_local;
  char *s1_local;
  
  p2 = __s;
  do {
    local_30 = __accept;
    if (*p2 == '\0') {
      return (char *)0x0;
    }
    while (*local_30 != '\0') {
      cVar1 = *local_30;
      local_30 = local_30 + 1;
      if (*p2 == cVar1) {
        return p2;
      }
    }
    p2 = p2 + 1;
  } while( true );
}

Assistant:

char * strpbrk( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *p1 )
    {
        p2 = s2;

        while ( *p2 )
        {
            if ( *p1 == *p2++ )
            {
                return ( char * ) p1;
            }
        }

        ++p1;
    }

    return NULL;
}